

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O2

string * __thiscall
pbrt::SpectrumImageTexture::ToString_abi_cxx11_
          (string *__return_storage_ptr__,SpectrumImageTexture *this)

{
  MIPMap *unaff_RBX;
  
  StringPrintf<pbrt::TextureMapping2DHandle_const&,float_const&,bool_const&,pbrt::MIPMap&>
            (__return_storage_ptr__,
             (pbrt *)"[ SpectrumImageTexture mapping: %s scale: %f invert: %s mipmap: %s ]",
             (char *)this,(TextureMapping2DHandle *)&(this->super_ImageTextureBase).scale,
             (float *)&(this->super_ImageTextureBase).invert,
             (bool *)(this->super_ImageTextureBase).mipmap,unaff_RBX);
  return __return_storage_ptr__;
}

Assistant:

std::string SpectrumImageTexture::ToString() const {
    return StringPrintf(
        "[ SpectrumImageTexture mapping: %s scale: %f invert: %s mipmap: %s ]", mapping,
        scale, invert, *mipmap);
}